

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int DLevelScript::ThingCount(int type,int stringid,int tid,int tag)

{
  byte bVar1;
  PClass *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  PClassActor *this;
  char *name;
  undefined8 *puVar6;
  undefined8 *puVar7;
  PClassActor *pPVar8;
  PClass *pPVar9;
  DThinker *pDVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar11;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator local_48;
  
  if (type < 1) {
    if (stringid < 0) {
      this = (PClassActor *)0x0;
    }
    else {
      name = FBehavior::StaticLookupString(stringid);
      if (name == (char *)0x0) {
        return 0;
      }
      this = PClass::FindActor(name);
      if (this == (PClassActor *)0x0) {
        return 0;
      }
    }
  }
  else {
    this = P_GetSpawnableType(type);
    if (this == (PClassActor *)0x0) {
      return 0;
    }
  }
  puVar6 = (undefined8 *)((long)AActor::TIDHash + (ulong)((tid & 0x7fU) << 3));
  bVar1 = 1;
  iVar4 = 0;
  do {
    puVar7 = puVar6;
    if (tid != 0) {
      do {
        puVar11 = (undefined8 *)*puVar7;
        while( true ) {
          if (puVar11 == (undefined8 *)0x0) goto LAB_0050d2ac;
          if (*(int *)(puVar11 + 0x4c) == tid) break;
          puVar11 = (undefined8 *)puVar11[0x51];
        }
        if (0 < *(int *)((long)puVar11 + 0x1cc)) {
          if (this != (PClassActor *)0x0) {
            pPVar8 = (PClassActor *)puVar11[1];
            if (pPVar8 == (PClassActor *)0x0) {
              pPVar8 = (PClassActor *)(**(code **)*puVar11)(puVar11);
              puVar11[1] = pPVar8;
            }
            if (pPVar8 != this) goto LAB_0050d18c;
          }
          if ((tag == -1) ||
             (bVar3 = FTagManager::SectorHasTag(&tagManager,(sector_t *)puVar11[0x22],tag), bVar3))
          {
            pPVar2 = AInventory::RegistrationInfo.MyClass;
            pPVar9 = (PClass *)puVar11[1];
            if (pPVar9 == (PClass *)0x0) {
              pPVar9 = (PClass *)(**(code **)*puVar11)(puVar11);
              puVar11[1] = pPVar9;
            }
            bVar3 = pPVar9 != (PClass *)0x0;
            if (pPVar9 != pPVar2 && bVar3) {
              do {
                pPVar9 = pPVar9->ParentClass;
                bVar3 = pPVar9 != (PClass *)0x0;
                if (pPVar9 == pPVar2) break;
              } while (pPVar9 != (PClass *)0x0);
            }
            if ((bVar3) && (puVar11[0x94] != 0)) {
              if ((*(byte *)(puVar11[0x94] + 0x20) & 0x20) == 0) goto LAB_0050d18c;
              puVar11[0x94] = 0;
            }
            iVar4 = iVar4 + 1;
          }
        }
LAB_0050d18c:
        puVar7 = puVar11 + 0x51;
        if (puVar11 == (undefined8 *)0x0) {
          puVar7 = puVar6;
        }
      } while( true );
    }
    FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
    pDVar10 = FThinkerIterator::Next(&local_48);
    while (pDVar10 != (DThinker *)0x0) {
      if (0 < *(int *)((long)&pDVar10[8].super_DObject.Class + 4)) {
        if (this != (PClassActor *)0x0) {
          pPVar8 = (PClassActor *)(pDVar10->super_DObject).Class;
          if (pPVar8 == (PClassActor *)0x0) {
            iVar5 = (**(pDVar10->super_DObject)._vptr_DObject)(pDVar10);
            pPVar8 = (PClassActor *)CONCAT44(extraout_var,iVar5);
            (pDVar10->super_DObject).Class = (PClass *)pPVar8;
          }
          if (pPVar8 != this) goto LAB_0050d298;
        }
        if ((tag == -1) ||
           (bVar3 = FTagManager::SectorHasTag(&tagManager,(sector_t *)pDVar10[4].PrevThinker,tag),
           bVar3)) {
          pPVar2 = AInventory::RegistrationInfo.MyClass;
          pPVar9 = (pDVar10->super_DObject).Class;
          if (pPVar9 == (PClass *)0x0) {
            iVar5 = (**(pDVar10->super_DObject)._vptr_DObject)(pDVar10);
            pPVar9 = (PClass *)CONCAT44(extraout_var_00,iVar5);
            (pDVar10->super_DObject).Class = pPVar9;
          }
          bVar3 = pPVar9 != (PClass *)0x0;
          if (pPVar9 != pPVar2 && bVar3) {
            do {
              pPVar9 = pPVar9->ParentClass;
              bVar3 = pPVar9 != (PClass *)0x0;
              if (pPVar9 == pPVar2) break;
            } while (pPVar9 != (PClass *)0x0);
          }
          if ((bVar3) && (pPVar9 = pDVar10[0x15].super_DObject.Class, pPVar9 != (PClass *)0x0)) {
            if (((pPVar9->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                 super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0050d298;
            pDVar10[0x15].super_DObject.Class = (PClass *)0x0;
          }
          iVar4 = iVar4 + 1;
        }
      }
LAB_0050d298:
      pDVar10 = FThinkerIterator::Next(&local_48);
    }
LAB_0050d2ac:
    if ((bool)(~bVar1 & 1 | this == (PClassActor *)0x0)) {
      return iVar4;
    }
    pPVar8 = PClassActor::GetReplacement(this,true);
    bVar1 = 0;
    bVar3 = pPVar8 == this;
    this = pPVar8;
    if (bVar3) {
      return iVar4;
    }
  } while( true );
}

Assistant:

int DLevelScript::ThingCount (int type, int stringid, int tid, int tag)
{
	AActor *actor;
	PClassActor *kind;
	int count = 0;
	bool replacemented = false;

	if (type > 0)
	{
		kind = P_GetSpawnableType(type);
		if (kind == NULL)
			return 0;
	}
	else if (stringid >= 0)
	{
		const char *type_name = FBehavior::StaticLookupString (stringid);
		if (type_name == NULL)
			return 0;

		kind = PClass::FindActor(type_name);
		if (kind == NULL)
			return 0;
	}
	else
	{
		kind = NULL;
	}

do_count:
	if (tid)
	{
		FActorIterator iterator (tid);
		while ( (actor = iterator.Next ()) )
		{
			if (actor->health > 0 &&
				(kind == NULL || actor->IsA (kind)))
			{
				if (tag == -1 || tagManager.SectorHasTag(actor->Sector, tag))
				{
					// Don't count items in somebody's inventory
					if (!actor->IsKindOf (RUNTIME_CLASS(AInventory)) ||
						static_cast<AInventory *>(actor)->Owner == NULL)
					{
						count++;
					}
				}
			}
		}
	}
	else
	{
		TThinkerIterator<AActor> iterator;
		while ( (actor = iterator.Next ()) )
		{
			if (actor->health > 0 &&
				(kind == NULL || actor->IsA (kind)))
			{
				if (tag == -1 || tagManager.SectorHasTag(actor->Sector, tag))
				{
					// Don't count items in somebody's inventory
					if (!actor->IsKindOf (RUNTIME_CLASS(AInventory)) ||
						static_cast<AInventory *>(actor)->Owner == NULL)
					{
						count++;
					}
				}
			}
		}
	}
	if (!replacemented && kind != NULL)
	{
		// Again, with decorate replacements
		replacemented = true;
		PClassActor *newkind = kind->GetReplacement();
		if (newkind != kind)
		{
			kind = newkind;
			goto do_count;
		}
	}
	return count;
}